

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O0

int scp_finish_filerecv(void)

{
  FILE *stream;
  _Bool _Var1;
  char *pcVar2;
  int local_30;
  int local_2c;
  int len;
  int ret;
  void *vbuf;
  sftp_request *req;
  sftp_packet *pktin;
  
  if (using_sftp) {
    xfer_set_error(scp_sftp_xfer);
    while (_Var1 = xfer_done(scp_sftp_xfer), ((_Var1 ^ 0xffU) & 1) != 0) {
      req = (sftp_request *)sftp_recv();
      local_2c = xfer_download_gotpkt(scp_sftp_xfer,(sftp_packet *)req);
      stream = _stderr;
      if (local_2c < 1) {
        pcVar2 = fxp_error();
        tell_user(stream,"pscp: error while reading: %s",pcVar2);
        if (local_2c == -0x80000000) {
          safefree(req);
        }
        errs = errs + 1;
        return -1;
      }
      _Var1 = xfer_download_data(scp_sftp_xfer,(void **)&len,&local_30);
      if (_Var1) {
        safefree(_len);
      }
    }
    xfer_cleanup(scp_sftp_xfer);
    vbuf = fxp_close_send(scp_sftp_filehandle);
    req = (sftp_request *)sftp_wait_for_reply((sftp_request *)vbuf);
    fxp_close_recv((sftp_packet *)req,(sftp_request *)vbuf);
    pktin._4_4_ = 0;
  }
  else {
    backend_send(backend,anon_var_dwarf_23ee3 + 10,1);
    pktin._4_4_ = response();
  }
  return pktin._4_4_;
}

Assistant:

int scp_finish_filerecv(void)
{
    if (using_sftp) {
        struct sftp_packet *pktin;
        struct sftp_request *req;

        /*
         * Ensure that xfer_done() will work correctly, so we can
         * clean up any outstanding requests from the file
         * transfer.
         */
        xfer_set_error(scp_sftp_xfer);
        while (!xfer_done(scp_sftp_xfer)) {
            void *vbuf;
            int ret, len;

            pktin = sftp_recv();
            ret = xfer_download_gotpkt(scp_sftp_xfer, pktin);
            if (ret <= 0) {
                tell_user(stderr, "pscp: error while reading: %s", fxp_error());
                if (ret == INT_MIN)        /* pktin not even freed */
                    sfree(pktin);
                errs++;
                return -1;
            }
            if (xfer_download_data(scp_sftp_xfer, &vbuf, &len))
                sfree(vbuf);
        }
        xfer_cleanup(scp_sftp_xfer);

        req = fxp_close_send(scp_sftp_filehandle);
        pktin = sftp_wait_for_reply(req);
        fxp_close_recv(pktin, req);
        return 0;
    } else {
        backend_send(backend, "", 1);
        return response();
    }
}